

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

Definition * __thiscall cppforth::Forth::getDefinition(Forth *this,Cell index)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pDVar6;
  Cell CVar7;
  ulong uVar8;
  ulong uVar9;
  string __str;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar9 = (ulong)index;
  pDVar6 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
          -0x3333333333333333;
  if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
    uVar3 = 1;
    if (9 < index) {
      uVar2 = 4;
      CVar7 = index;
      do {
        uVar3 = uVar2;
        if (CVar7 < 100) {
          uVar3 = uVar3 - 2;
          goto LAB_0011c036;
        }
        if (CVar7 < 1000) {
          uVar3 = uVar3 - 1;
          goto LAB_0011c036;
        }
        if (CVar7 < 10000) goto LAB_0011c036;
        bVar1 = 99999 < CVar7;
        uVar2 = uVar3 + 4;
        CVar7 = CVar7 / 10000;
      } while (bVar1);
      uVar3 = uVar3 + 1;
    }
LAB_0011c036:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_48,(ulong)uVar3,'\0');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,index);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_48,0,0,"Access to definitions out of range ",0x23);
    local_68._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar5) {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    throwCppExceptionMessage(this,&local_68,errorUndefinedWord);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pDVar6 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return pDVar6 + uVar9;
}

Assistant:

Definition *getDefinition(Cell index){
			if ((index < 0) || (index >= definitions.size())){
					throwCppExceptionMessage("Access to definitions out of range "+std::to_string(index),errorUndefinedWord);
			}
			return &definitions[index];
		}